

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

ssize_t __thiscall
capnp::anon_unknown_0::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 in_register_00000034;
  Exception *other;
  Own<capnp::(anonymous_namespace)::BrokenPipeline> local_1c8;
  Own<capnp::PipelineHook> local_1b8;
  Own<kj::_::PromiseNode> local_1a8;
  Pipeline local_198;
  Exception local_170;
  
  other = (Exception *)(CONCAT44(in_register_00000034,__fd) + 8);
  kj::Exception::Exception(&local_170,other);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)&local_1a8,&local_170);
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)&local_1c8,other);
  local_198.hook.ptr = &(local_1c8.ptr)->super_PipelineHook;
  local_1c8.ptr = (BrokenPipeline *)0x0;
  local_1b8.disposer = local_1c8.disposer;
  local_198.hook.disposer = local_1c8.disposer;
  local_1b8.ptr = (PipelineHook *)0x0;
  local_198.ops.ptr = (PipelineOp *)0x0;
  local_198.ops.size_ = 0;
  local_198.ops.disposer = (ArrayDisposer *)0x0;
  RemotePromise<capnp::AnyPointer>::RemotePromise
            ((RemotePromise<capnp::AnyPointer> *)this,
             (Promise<capnp::Response<capnp::AnyPointer>_> *)&local_1a8,&local_198);
  AnyPointer::Pipeline::~Pipeline(&local_198);
  kj::Own<capnp::PipelineHook>::dispose(&local_1b8);
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline>::~Own(&local_1c8);
  kj::Own<kj::_::PromiseNode>::dispose(&local_1a8);
  kj::Exception::~Exception(&local_170);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }